

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

ChQuaternion<double> *
chrono::AngleDT_to_QuatDT
          (ChQuaternion<double> *__return_storage_ptr__,AngleSet angset,ChVector<double> *mangles,
          ChQuaternion<double> *q)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  ChQuaternion<double> result;
  ChQuaternion<double> local_68;
  ChVector<double> local_48;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  Quat_to_Angle((ChVector<double> *)&local_68,angset,q);
  auVar3._8_8_ = 0x3f1a36e2eb1c432d;
  auVar3._0_8_ = 0x3f1a36e2eb1c432d;
  auVar3 = vmulpd_avx512vl(*(undefined1 (*) [16])mangles->m_data,auVar3);
  local_48.m_data[0] = auVar3._0_8_ + local_68.m_data[0];
  local_48.m_data[1] = auVar3._8_8_ + local_68.m_data[1];
  local_48.m_data[2] = mangles->m_data[2] * 0.0001 + local_68.m_data[2];
  Angle_to_Quat(&local_68,angset,&local_48);
  auVar1 = vsubpd_avx((undefined1  [32])local_68.m_data,*(undefined1 (*) [32])q->m_data);
  auVar2._8_8_ = 0x40c3880000000000;
  auVar2._0_8_ = 0x40c3880000000000;
  auVar2._16_8_ = 0x40c3880000000000;
  auVar2._24_8_ = 0x40c3880000000000;
  local_68.m_data = (double  [4])vmulpd_avx512vl(auVar1,auVar2);
  ChQuaternion<double>::operator=(__return_storage_ptr__,&local_68);
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> AngleDT_to_QuatDT(AngleSet angset,
                                       const ChVector<double>& mangles,
                                       const ChQuaternion<double>& q) {
    ChQuaternion<double> res;
    ChQuaternion<double> q2;
    ChVector<double> ang1, ang2;

    ang1 = Quat_to_Angle(angset, q);
    ang2 = Vadd(ang1, Vmul(mangles, BDF_STEP_HIGH));
    q2 = Angle_to_Quat(angset, ang2);
    res = Qscale(Qsub(q2, q), 1 / BDF_STEP_HIGH);

    return res;
}